

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O2

void __thiscall
ElementsTransactionApi_FundRawTransaction_AssetLimitAmountValue_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_AssetLimitAmountValue_Test *this)

{
  Txid *this_00;
  bool bVar1;
  uint32_t uVar2;
  long lVar3;
  char *pcVar4;
  Amount AVar5;
  initializer_list<cfd::UtxoData> __l;
  allocator local_2f02;
  allocator local_2f01;
  string local_2f00;
  ConfidentialTransactionController ctx;
  AssertionResult gtest_ar;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2db8;
  uint32_t minimum_fee;
  undefined4 uStack_2d9c;
  ByteData tx;
  ElementsAddressFactory factory;
  UtxoFilter filter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext txc;
  SigHashType local_2c0c;
  SigHashType local_2c00;
  SigHashType local_2bf4;
  Amount fee;
  Amount estimate_fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  ConfidentialAssetId fee_asset;
  CoinSelectionOption option;
  ElementsConfidentialAddress reserve_ct_addr2;
  ExtPubkey key;
  ElementsConfidentialAddress reserve_ct_addr3;
  ElementsConfidentialAddress reserve_ct_addr4;
  UtxoData utxo3;
  UtxoData utxo2;
  ElementsConfidentialAddress reserve_ct_addr1;
  UtxoData local_15a8;
  UtxoData local_1080;
  UtxoData utxo1;
  Address address4;
  Address address3;
  Address address2;
  Address address1;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory(&factory,kElementsRegtest);
  cfd::UtxoData::UtxoData(&utxo1);
  utxo1.block_height = 0;
  utxo1.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo2,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&utxo3);
  cfd::core::Txid::Txid((Txid *)&reserve_ct_addr1,(string *)&utxo2);
  this_00 = &utxo1.txid;
  cfd::core::Txid::operator=(this_00,(Txid *)&reserve_ct_addr1);
  cfd::core::Txid::~Txid((Txid *)&reserve_ct_addr1);
  std::__cxx11::string::~string((string *)&utxo2);
  utxo1.vout = 0;
  std::__cxx11::string::string
            ((string *)&utxo2,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",
             (allocator *)&utxo3);
  cfd::core::Script::Script((Script *)&reserve_ct_addr1,(string *)&utxo2);
  cfd::core::Script::operator=(&utxo1.locking_script,(Script *)&reserve_ct_addr1);
  cfd::core::Script::~Script((Script *)&reserve_ct_addr1);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo2,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",(allocator *)&utxo3);
  cfd::AddressFactory::GetAddress
            (&reserve_ct_addr1.unblinded_address_,&factory.super_AddressFactory,(string *)&utxo2);
  cfd::core::Address::operator=(&utxo1.address,&reserve_ct_addr1.unblinded_address_);
  cfd::core::Address::~Address(&reserve_ct_addr1.unblinded_address_);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::assign((char *)&utxo1.descriptor);
  cfd::core::Amount::Amount((Amount *)&reserve_ct_addr1,2000000000000000);
  utxo1.amount.ignore_check_ = (bool)(undefined1)reserve_ct_addr1.unblinded_address_.witness_ver_;
  utxo1.amount.amount_._0_4_ = reserve_ct_addr1.unblinded_address_.type_;
  utxo1.amount.amount_._4_4_ = reserve_ct_addr1.unblinded_address_.addr_type_;
  utxo1.address_type = kP2pkhAddress;
  cfd::core::ConfidentialAssetId::operator=(&utxo1.asset,&exp_dummy_asset_b);
  cfd::UtxoData::UtxoData(&utxo2);
  utxo2.block_height = 0;
  utxo2.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo3,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             (allocator *)&reserve_ct_addr2);
  cfd::core::Txid::Txid((Txid *)&reserve_ct_addr1,(string *)&utxo3);
  cfd::core::Txid::operator=(&utxo2.txid,(Txid *)&reserve_ct_addr1);
  cfd::core::Txid::~Txid((Txid *)&reserve_ct_addr1);
  std::__cxx11::string::~string((string *)&utxo3);
  utxo2.vout = 0;
  std::__cxx11::string::string
            ((string *)&utxo3,"a9145d54db96a28f844a744e393fcd699d6f825b284187",
             (allocator *)&reserve_ct_addr2);
  cfd::core::Script::Script((Script *)&reserve_ct_addr1,(string *)&utxo3);
  cfd::core::Script::operator=(&utxo2.locking_script,(Script *)&reserve_ct_addr1);
  cfd::core::Script::~Script((Script *)&reserve_ct_addr1);
  std::__cxx11::string::~string((string *)&utxo3);
  std::__cxx11::string::string
            ((string *)&utxo3,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE",(allocator *)&reserve_ct_addr2);
  cfd::AddressFactory::GetAddress
            (&reserve_ct_addr1.unblinded_address_,&factory.super_AddressFactory,(string *)&utxo3);
  cfd::core::Address::operator=(&utxo2.address,&reserve_ct_addr1.unblinded_address_);
  cfd::core::Address::~Address(&reserve_ct_addr1.unblinded_address_);
  std::__cxx11::string::~string((string *)&utxo3);
  std::__cxx11::string::assign((char *)&utxo2.descriptor);
  cfd::core::Amount::Amount((Amount *)&reserve_ct_addr1,2000000000000000);
  utxo2.amount.ignore_check_ = (bool)(undefined1)reserve_ct_addr1.unblinded_address_.witness_ver_;
  utxo2.amount.amount_._0_4_ = reserve_ct_addr1.unblinded_address_.type_;
  utxo2.amount.amount_._4_4_ = reserve_ct_addr1.unblinded_address_.addr_type_;
  utxo2.address_type = kP2shP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(&utxo2.asset,&exp_dummy_asset_b);
  cfd::UtxoData::UtxoData(&utxo3);
  utxo3.block_height = 0;
  utxo3.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&reserve_ct_addr2,
             "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&reserve_ct_addr3);
  cfd::core::Txid::Txid((Txid *)&reserve_ct_addr1,(string *)&reserve_ct_addr2);
  cfd::core::Txid::operator=(&utxo3.txid,(Txid *)&reserve_ct_addr1);
  cfd::core::Txid::~Txid((Txid *)&reserve_ct_addr1);
  std::__cxx11::string::~string((string *)&reserve_ct_addr2);
  utxo3.vout = 1;
  std::__cxx11::string::string
            ((string *)&reserve_ct_addr2,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4",
             (allocator *)&reserve_ct_addr3);
  cfd::core::Script::Script((Script *)&reserve_ct_addr1,(string *)&reserve_ct_addr2);
  cfd::core::Script::operator=(&utxo3.locking_script,(Script *)&reserve_ct_addr1);
  cfd::core::Script::~Script((Script *)&reserve_ct_addr1);
  std::__cxx11::string::~string((string *)&reserve_ct_addr2);
  std::__cxx11::string::string
            ((string *)&reserve_ct_addr2,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w",
             (allocator *)&reserve_ct_addr3);
  cfd::AddressFactory::GetAddress
            (&reserve_ct_addr1.unblinded_address_,&factory.super_AddressFactory,
             (string *)&reserve_ct_addr2);
  cfd::core::Address::operator=(&utxo3.address,&reserve_ct_addr1.unblinded_address_);
  cfd::core::Address::~Address(&reserve_ct_addr1.unblinded_address_);
  std::__cxx11::string::~string((string *)&reserve_ct_addr2);
  std::__cxx11::string::assign((char *)&utxo3.descriptor);
  cfd::core::Amount::Amount((Amount *)&reserve_ct_addr1,50000000000000);
  utxo3.amount.ignore_check_ = (bool)(undefined1)reserve_ct_addr1.unblinded_address_.witness_ver_;
  utxo3.amount.amount_._0_4_ = reserve_ct_addr1.unblinded_address_.type_;
  utxo3.amount.amount_._4_4_ = reserve_ct_addr1.unblinded_address_.addr_type_;
  utxo3.address_type = kP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(&utxo3.asset,&exp_dummy_asset_a);
  std::__cxx11::string::string
            ((string *)&reserve_ct_addr1,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",
             (allocator *)&reserve_ct_addr2);
  cfd::AddressFactory::GetAddress
            (&address1,&factory.super_AddressFactory,(string *)&reserve_ct_addr1);
  std::__cxx11::string::~string((string *)&reserve_ct_addr1);
  std::__cxx11::string::string
            ((string *)&reserve_ct_addr1,"ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu",
             (allocator *)&reserve_ct_addr2);
  cfd::AddressFactory::GetAddress
            (&address2,&factory.super_AddressFactory,(string *)&reserve_ct_addr1);
  std::__cxx11::string::~string((string *)&reserve_ct_addr1);
  std::__cxx11::string::string
            ((string *)&reserve_ct_addr1,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w",
             (allocator *)&reserve_ct_addr2);
  cfd::AddressFactory::GetAddress
            (&address3,&factory.super_AddressFactory,(string *)&reserve_ct_addr1);
  std::__cxx11::string::~string((string *)&reserve_ct_addr1);
  std::__cxx11::string::string
            ((string *)&reserve_ct_addr1,"ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu",
             (allocator *)&reserve_ct_addr2);
  cfd::AddressFactory::GetAddress
            (&address4,&factory.super_AddressFactory,(string *)&reserve_ct_addr1);
  std::__cxx11::string::~string((string *)&reserve_ct_addr1);
  std::__cxx11::string::string
            ((string *)&reserve_ct_addr1,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,(allocator *)&reserve_ct_addr2);
  cfd::core::ExtPubkey::ExtPubkey(&key,(string *)&reserve_ct_addr1);
  std::__cxx11::string::~string((string *)&reserve_ct_addr1);
  cfd::UtxoData::UtxoData((UtxoData *)&reserve_ct_addr1,&utxo1);
  cfd::UtxoData::UtxoData(&local_15a8,&utxo2);
  cfd::UtxoData::UtxoData(&local_1080,&utxo3);
  __l._M_len = 3;
  __l._M_array = (iterator)&reserve_ct_addr1;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&utxos,__l,(allocator_type *)&reserve_ct_addr2);
  lVar3 = 0xa50;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)((long)&reserve_ct_addr1.unblinded_address_.type_ + lVar3))
    ;
    lVar3 = lVar3 + -0x528;
  } while (lVar3 != -0x528);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&reserve_ct_addr2,&key,0x5b);
  cfd::core::Extkey::GetPubkey((Pubkey *)&reserve_ct_addr3,(Extkey *)&reserve_ct_addr2);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&reserve_ct_addr1,&address1,(ConfidentialKey *)&reserve_ct_addr3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&reserve_ct_addr3);
  cfd::core::Extkey::~Extkey((Extkey *)&reserve_ct_addr2);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&reserve_ct_addr3,&key,0x5c);
  cfd::core::Extkey::GetPubkey((Pubkey *)&reserve_ct_addr4,(Extkey *)&reserve_ct_addr3);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&reserve_ct_addr2,&address2,(ConfidentialKey *)&reserve_ct_addr4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&reserve_ct_addr4);
  cfd::core::Extkey::~Extkey((Extkey *)&reserve_ct_addr3);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&reserve_ct_addr4,&key,0x5d);
  cfd::core::Extkey::GetPubkey((Pubkey *)&txc,(Extkey *)&reserve_ct_addr4);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&reserve_ct_addr3,&address3,(ConfidentialKey *)&txc);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txc);
  cfd::core::Extkey::~Extkey((Extkey *)&reserve_ct_addr4);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&txc,&key,0x5e);
  cfd::core::Extkey::GetPubkey((Pubkey *)&gtest_ar,(Extkey *)&txc);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&reserve_ct_addr4,&address4,(ConfidentialKey *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  cfd::core::Extkey::~Extkey((Extkey *)&txc);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&fee_asset,&exp_dummy_asset_a);
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_target_value._M_t._M_impl.super__Rb_tree_header._M_header;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txc,&exp_dummy_asset_a);
  cfd::core::Amount::Amount((Amount *)&gtest_ar);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&map_target_value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txc,
             (Amount *)&gtest_ar);
  std::__cxx11::string::~string((string *)&txc);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txc,&exp_dummy_asset_b);
  cfd::core::Amount::Amount((Amount *)&gtest_ar);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&map_target_value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txc,
             (Amount *)&gtest_ar);
  std::__cxx11::string::~string((string *)&txc);
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txc,&exp_dummy_asset_a);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            ((string *)&gtest_ar,&reserve_ct_addr3);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&reserve_txout_address,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txc,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&txc);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txc,&exp_dummy_asset_b);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            ((string *)&gtest_ar,&reserve_ct_addr4);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&reserve_txout_address,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txc,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&txc);
  selected_txin_utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  selected_txin_utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  selected_txin_utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Amount::Amount(&estimate_fee);
  append_txout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  append_txout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  append_txout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&option);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&option);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option,0.11);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(&option,0.11);
  cfd::CoinSelectionOption::SetFeeAsset(&option,&fee_asset);
  cfd::CoinSelectionOption::SetBlindInfo(&option,0,0x34);
  cfd::core::Amount::Amount(&fee,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,2,0);
  AVar5 = cfd::core::operator-(&utxo3.amount,&fee);
  gtest_ar._0_8_ = AVar5.amount_;
  gtest_ar.message_.ptr_._0_1_ = AVar5.ignore_check_;
  cfd::ConfidentialTransactionContext::AddTxOut
            (&txc,&reserve_ct_addr1,(Amount *)&gtest_ar,&exp_dummy_asset_a,false);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,2100000000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&txc,&reserve_ct_addr2,(Amount *)&gtest_ar,&exp_dummy_asset_b,false);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&gtest_ar,(AbstractTransaction *)&txc)
  ;
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (&ctx,(ElementsTransactionApi *)&minimum_fee,(string *)&gtest_ar,&utxos,
             &map_target_value,&selected_txin_utxos,&reserve_txout_address,&fee_asset,true,0.11,
             &estimate_fee,&filter,&option,&append_txout_addresses,kCfdInvalidSettingError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            (&local_2f00,&ctx.super_AbstractTransactionController);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)&gtest_ar,&local_2f00);
  cfd::ConfidentialTransactionContext::operator=(&txc,(ConfidentialTransactionContext *)&gtest_ar);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_2f00);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctx);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo(&txc,&utxos);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ctx,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4b9,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  cfd::core::ByteData::ByteData(&tx);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_00,utxo1.vout);
      std::__cxx11::string::string
                ((string *)&ctx,"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"
                 ,&local_2f01);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_2db8,(string *)&ctx);
      std::__cxx11::string::string
                ((string *)&minimum_fee,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 &local_2f02);
      cfd::core::Privkey::FromWif((Privkey *)&local_2f00,(string *)&minimum_fee,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2bf4);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&txc,(OutPoint *)&gtest_ar,(Pubkey *)&local_2db8,(Privkey *)&local_2f00,&local_2bf4
                 ,true,(ByteData256 *)0x0,(ByteData *)0x0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2f00);
      std::__cxx11::string::~string((string *)&minimum_fee);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2db8);
      std::__cxx11::string::~string((string *)&ctx);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ctx,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c0,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_00,utxo1.vout);
      cfd::ConfidentialTransactionContext::Verify(&txc,(OutPoint *)&gtest_ar);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ctx,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c1,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::ConfidentialTransactionContext::Finalize((ByteData *)&gtest_ar,&txc);
    cfd::core::ByteData::operator=(&tx,(ByteData *)&gtest_ar);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&ctx,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x4c2,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,&utxo2.txid,utxo2.vout);
      std::__cxx11::string::string
                ((string *)&ctx,"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
                 ,&local_2f01);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_2db8,(string *)&ctx);
      std::__cxx11::string::string
                ((string *)&minimum_fee,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
                 &local_2f02);
      cfd::core::Privkey::FromWif((Privkey *)&local_2f00,(string *)&minimum_fee,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2c00);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&txc,(OutPoint *)&gtest_ar,(Pubkey *)&local_2db8,(Privkey *)&local_2f00,&local_2c00
                 ,true,(ByteData256 *)0x0,(ByteData *)0x0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2f00);
      std::__cxx11::string::~string((string *)&minimum_fee);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2db8);
      std::__cxx11::string::~string((string *)&ctx);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ctx,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c7,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,&utxo2.txid,utxo2.vout);
      cfd::ConfidentialTransactionContext::Verify(&txc,(OutPoint *)&gtest_ar);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ctx,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c8,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::ConfidentialTransactionContext::Finalize((ByteData *)&gtest_ar,&txc);
    cfd::core::ByteData::operator=(&tx,(ByteData *)&gtest_ar);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&ctx,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x4c9,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,&utxo3.txid,utxo3.vout);
      std::__cxx11::string::string
                ((string *)&ctx,"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"
                 ,&local_2f01);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_2db8,(string *)&ctx);
      std::__cxx11::string::string
                ((string *)&minimum_fee,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 &local_2f02);
      cfd::core::Privkey::FromWif((Privkey *)&local_2f00,(string *)&minimum_fee,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2c0c);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&txc,(OutPoint *)&gtest_ar,(Pubkey *)&local_2db8,(Privkey *)&local_2f00,&local_2c0c
                 ,true,(ByteData256 *)0x0,(ByteData *)0x0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2f00);
      std::__cxx11::string::~string((string *)&minimum_fee);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2db8);
      std::__cxx11::string::~string((string *)&ctx);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ctx,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4ce,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,&utxo3.txid,utxo3.vout);
      cfd::ConfidentialTransactionContext::Verify(&txc,(OutPoint *)&gtest_ar);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ctx,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4cf,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize((ByteData *)&gtest_ar,&txc);
      cfd::core::ByteData::operator=(&tx,(ByteData *)&gtest_ar);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ctx,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d1,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  AVar5 = cfd::ConfidentialTransactionContext::GetFeeAmount(&txc,(ConfidentialAssetId *)0x0);
  ctx.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)AVar5.amount_;
  ctx.super_AbstractTransactionController.tx_address_._0_1_ = AVar5.ignore_check_;
  local_2f00._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)&ctx);
  _minimum_fee = (pointer)cfd::core::Amount::GetSatoshiValue(&estimate_fee);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"txc.GetFeeAmount().GetSatoshiValue()",
             "estimate_fee.GetSatoshiValue()",(long *)&local_2f00,(long *)&minimum_fee);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&ctx);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f00,(Message *)&ctx);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f00);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ctx);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,&tx);
  testing::internal::CmpHelperSTREQ
            ((internal *)&ctx,"tx.GetHex().c_str()",
             "\"020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000\""
             ,(char *)gtest_ar._0_8_,
             "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000"
            );
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((char)ctx.super_AbstractTransactionController._vptr_AbstractTransactionController == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if ((undefined8 *)
        CONCAT71(ctx.super_AbstractTransactionController.tx_address_._1_7_,
                 ctx.super_AbstractTransactionController.tx_address_._0_1_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT71(ctx.super_AbstractTransactionController.tx_address_._1_7_,
                                  ctx.super_AbstractTransactionController.tx_address_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f00,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f00);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&ctx.super_AbstractTransactionController.tx_address_);
  uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&txc.super_ConfidentialTransaction);
  ctx.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)
       CONCAT44(ctx.super_AbstractTransactionController._vptr_AbstractTransactionController._4_4_,
                uVar2);
  local_2f00._M_dataplus._M_p._0_4_ = 0x2f9;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"txc.GetVsize()","761",(uint *)&ctx,(int *)&local_2f00);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&ctx);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f00,(Message *)&ctx);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f00);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ctx);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&txc.super_ConfidentialTransaction);
  minimum_fee = (uVar2 * 0xb) / 100;
  ctx.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)
       CONCAT44(ctx.super_AbstractTransactionController._vptr_AbstractTransactionController._4_4_,
                0x53);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"minimum_fee","83",&minimum_fee,(int *)&ctx);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&ctx);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f00,(Message *)&ctx);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f00);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ctx);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&option.fee_asset_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&append_txout_addresses);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&selected_txin_utxos);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&reserve_txout_address._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&map_target_value._M_t);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&fee_asset);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&reserve_ct_addr4);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&reserve_ct_addr3);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&reserve_ct_addr2);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&reserve_ct_addr1);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::core::Extkey::~Extkey(&key.super_Extkey);
  cfd::core::Address::~Address(&address4);
  cfd::core::Address::~Address(&address3);
  cfd::core::Address::~Address(&address2);
  cfd::core::Address::~Address(&address1);
  cfd::UtxoData::~UtxoData(&utxo3);
  cfd::UtxoData::~UtxoData(&utxo2);
  cfd::UtxoData::~UtxoData(&utxo1);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_AssetLimitAmountValue) {
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{2000000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = exp_dummy_asset_b;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{2000000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = exp_dummy_asset_b;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{50000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = exp_dummy_asset_a;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address1 = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2 = factory.GetAddress("ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu");
  Address address3 = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  Address address4 = factory.GetAddress("ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu");

  ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
      address1, key.DerivePubkey(91).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
      address2, key.DerivePubkey(92).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
      address3, key.DerivePubkey(93).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr4 = ElementsConfidentialAddress(
      address4, key.DerivePubkey(94).GetPubkey());

  double fee_rate = 0.11;
  ConfidentialAssetId fee_asset = exp_dummy_asset_a;
  std::map<std::string, Amount> map_target_value;
  map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount());
  map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount());
  std::map<std::string, std::string> reserve_txout_address;
  reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), reserve_ct_addr3.GetAddress());
  reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), reserve_ct_addr4.GetAddress());
  std::vector<ElementsUtxoAndOption> selected_txin_utxos;
  Amount estimate_fee;
  UtxoFilter filter;
  std::vector<std::string> append_txout_addresses;
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  option.SetEffectiveFeeBaserate(fee_rate);
  option.SetLongTermFeeBaserate(fee_rate);
  option.SetFeeAsset(fee_asset);
  option.SetBlindInfo(0, 52);

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  txc.AddTxOut(reserve_ct_addr1, utxo3.amount - fee, exp_dummy_asset_a);
  txc.AddTxOut(reserve_ct_addr2, Amount(int64_t{2100000000000000}), exp_dummy_asset_b);

  try {
    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        txc.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);
    txc = ConfidentialTransactionContext(ctx.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000");
  EXPECT_EQ(txc.GetVsize(), 761);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(fee_rate * 100) / 100;
  EXPECT_EQ(minimum_fee, 83);
}